

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  if (expr->_id != ArrayNewFixedId) {
    __assert_fail("expression->is<ArrayNewFixed>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x10bc,
                  "BinaryenExpressionRef BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < expr[1].type.id) {
    return *(BinaryenExpressionRef *)(*(long *)(expr + 1) + (ulong)index * 8);
  }
  __assert_fail("index < static_cast<ArrayNewFixed*>(expression)->values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x10bd,
                "BinaryenExpressionRef BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef
BinaryenArrayNewFixedGetValueAt(BinaryenExpressionRef expr,
                                BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayNewFixed>());
  assert(index < static_cast<ArrayNewFixed*>(expression)->values.size());
  return static_cast<ArrayNewFixed*>(expression)->values[index];
}